

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Performance::anon_unknown_1::ModifyAfterWithBufferDataCase::testWithBufferSize
          (ModifyAfterWithBufferDataCase *this,
          UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
          *result,int bufferSize)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  deUint64 dVar3;
  deUint64 dVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  iVar1 = (*((this->
             super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
             ).
             super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
             .super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  uVar5 = (int)((float)bufferSize * this->m_sizeDifferenceFactor) + 0xfU & 0xfffffff0;
  if (this->m_respecifySize == false) {
    uVar5 = bufferSize;
  }
  if (this->m_repeatedUpload == true) {
    iVar6 = bufferSize * 3 + 3;
    if (-1 < bufferSize * 3) {
      iVar6 = bufferSize * 3;
    }
    iVar7 = bufferSize + 3;
    if (-1 < bufferSize) {
      iVar7 = bufferSize;
    }
    iVar8 = 1;
    do {
      (**(code **)(CONCAT44(extraout_var,iVar1) + 0x150))
                (0x8892,(long)(int)uVar5,
                 (this->
                 super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                 ).m_zeroData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 (this->
                 super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                 ).m_bufferUsage);
      iVar2 = (*((this->
                 super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                 ).
                 super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                 .super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0x538))(0,(iVar7 >> 2) + 0xf >> 4,1);
      (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0x538))(0,((iVar6 >> 2) + 0xf >> 4) + -1,1);
      iVar8 = iVar8 + -1;
    } while (iVar8 == 0);
  }
  dVar3 = deGetMicroseconds();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x150))
            (0x8892,(long)(int)uVar5,
             (this->
             super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
             ).m_zeroData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->
             super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
             ).m_bufferUsage);
  dVar4 = deGetMicroseconds();
  (result->duration).totalDuration = dVar4 - dVar3;
  (result->duration).fitResponseDuration = dVar4 - dVar3;
  result->writtenSize = uVar5;
  return;
}

Assistant:

void ModifyAfterWithBufferDataCase::testWithBufferSize (UploadSampleResult<SingleOperationDuration>& result, int bufferSize)
{
	// always draw the same amount to make compares between cases sensible
	const int					drawStart			= deAlign32(bufferSize / 4, 4*4);
	const int					drawEnd				= deAlign32(bufferSize * 3 / 4, 4*4);

	const glw::Functions&		gl					= m_context.getRenderContext().getFunctions();
	const int					largerBufferSize	= deAlign32((int)((float)bufferSize * m_sizeDifferenceFactor), 4*4);
	const int					newBufferSize		= (m_respecifySize) ? (largerBufferSize) : (bufferSize);
	deUint64					startTime;
	deUint64					endTime;

	// repeat upload-draw
	if (m_repeatedUpload)
	{
		for (int repeatNdx = 0; repeatNdx < NUM_REPEATS; ++repeatNdx)
		{
			gl.bufferData(GL_ARRAY_BUFFER, newBufferSize, &m_zeroData[0], m_bufferUsage);
			drawBufferRange(drawStart, drawEnd);
		}
	}

	// test upload
	startTime = deGetMicroseconds();
	gl.bufferData(GL_ARRAY_BUFFER, newBufferSize, &m_zeroData[0], m_bufferUsage);
	endTime = deGetMicroseconds();

	result.duration.totalDuration = endTime - startTime;
	result.duration.fitResponseDuration = result.duration.totalDuration;
	result.writtenSize = newBufferSize;
}